

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

int ON_StringCompareOrdinalUTF8
              (char *string1,int element_count1,char *string2,int element_count2,
              bool bOrdinalIgnoreCase)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  char null_terminator;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (element_count1 != 0 && string1 == (char *)0x0) {
    return -(uint)(string2 != (char *)0x0);
  }
  if (element_count2 != 0 && string2 == (char *)0x0) {
    return (uint)(string1 != (char *)0x0);
  }
  null_terminator = '\0';
  if (element_count1 < 0) {
    element_count1 = ON_String::Length(string1);
  }
  if (element_count2 < 0) {
    element_count2 = ON_String::Length(string2);
  }
  if (element_count1 == 0) {
    string1 = &null_terminator;
  }
  if (element_count2 == 0) {
    string2 = &null_terminator;
  }
  if (element_count1 == element_count2 && string1 == string2) {
    return 0;
  }
  local_3c = element_count2;
  local_34 = element_count1;
  if (element_count1 < element_count2) {
    element_count2 = element_count1;
  }
  uVar5 = 0;
  if (0 < element_count2) {
    uVar5 = element_count2;
  }
  local_38 = uVar5;
  uVar7 = (ulong)uVar5;
  if (bOrdinalIgnoreCase) {
    lVar8 = 0;
    do {
      if (uVar5 == (uint)lVar8) {
LAB_005c3163:
        pcVar6 = string2 + uVar7;
        if ((int)local_38 <= (int)local_34) {
          local_38 = local_34;
        }
        for (; (int)uVar7 < (int)local_34; uVar7 = uVar7 + 1) {
          if (string1[uVar7] != '\0') {
            return 1;
          }
        }
        while( true ) {
          if ((int)local_3c <= (int)local_38) {
            return 0;
          }
          if (*pcVar6 != '\0') break;
          pcVar6 = pcVar6 + 1;
          local_38 = local_38 + 1;
        }
        return -1;
      }
      uVar3 = OrdinalUTF8ToIgnoreCase(string1[lVar8]);
      uVar4 = OrdinalUTF8ToIgnoreCase(string2[lVar8]);
      if (uVar3 < uVar4) {
        return -1;
      }
      lVar8 = lVar8 + 1;
    } while (uVar3 <= uVar4);
  }
  else {
    lVar8 = 0;
    do {
      if (uVar5 == (uint)lVar8) goto LAB_005c3163;
      pbVar1 = (byte *)(string1 + lVar8);
      pbVar2 = (byte *)(string2 + lVar8);
      if (*pbVar1 < *pbVar2) {
        return -1;
      }
      lVar8 = lVar8 + 1;
    } while (*pbVar1 <= *pbVar2);
  }
  return 1;
}

Assistant:

int ON_StringCompareOrdinalUTF8(
  const char* string1,
  int element_count1,
  const char* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(char,ON_String::Length,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF8ToIgnoreCase(*string1++);
      c2 = OrdinalUTF8ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (unsigned char)(*string1++);
      c2 = (unsigned char)(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return 1;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return -1;
  }

  return 0;
}

int ON_StringCompareOrdinalUTF16(
  const ON__UINT16* string1,
  int element_count1,
  const ON__UINT16* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(ON__UINT16,ON_StringLengthUTF16,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF16ToIgnoreCase(*string1++);
      c2 = OrdinalUTF16ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (*string1++);
      c2 = (*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*string1++))
      return 1;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*string2++))
      return -1;
  }

  return 0;
}

int ON_StringCompareOrdinalUTF32(
  const ON__UINT32* string1,
  int element_count1,
  const ON__UINT32* string2,
  int element_count2,
  bool bOrdinalIgnoreCase
  )
{
  STRING_COMPARE_PREAMBLE(ON__UINT32,ON_StringLengthUTF32,string1,element_count1,string2,element_count2,0,-1,1);

  unsigned int c1, c2;
  int i;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;

  if (bOrdinalIgnoreCase)
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = OrdinalUTF32ToIgnoreCase(*string1++);
      c2 = OrdinalUTF32ToIgnoreCase(*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }
  }
  else
  {
    for (i = 0; i < element_count; i++)
    {
      c1 = (*string1++);
      c2 = (*string2++);
      if ( c1 < c2 )
        return -1;
      if ( c1 > c2 )
        return 1;
    }